

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O2

void __thiscall
llm_tokenizer_ugm::llm_tokenizer_ugm
          (llm_tokenizer_ugm *this,llama_vocab *vocab,
          vector<char,_std::allocator<char>_> *precompiled_charsmap)

{
  ulong uVar1;
  _Rb_tree_header *p_Var2;
  uint uVar3;
  uint *puVar4;
  _Head_base<0UL,_llama_vocab::impl_*,_false> _Var5;
  bool bVar6;
  ulong uVar7;
  token_data *ptVar8;
  runtime_error *this_00;
  uint32_t id;
  uint id_00;
  float fVar9;
  allocator<char> local_41;
  naive_trie *local_40;
  string *local_38;
  
  (this->super_llm_tokenizer)._vptr_llm_tokenizer = (_func_int **)&PTR__llm_tokenizer_ugm_002ce360;
  local_38 = &this->escaped_space;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,anon_var_dwarf_343004,&local_41);
  p_Var2 = &(this->user_defined_token_matcher).children._M_t._M_impl.super__Rb_tree_header;
  (this->user_defined_token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->user_defined_token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  this->prefix_replacements = (char *)0x0;
  this->prefix_replacements_size = 0;
  this->xcda_array = (uint32_t *)0x0;
  this->xcda_array_size = 0;
  (this->user_defined_token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->user_defined_token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var2->_M_header;
  (this->user_defined_token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  id_00 = 0;
  (this->user_defined_token_matcher).has_value = false;
  (this->user_defined_token_matcher).value = 0;
  local_40 = &this->user_defined_token_matcher;
  this->min_score = 3.4028235e+38;
  this->max_score = -3.4028235e+38;
  this->unknown_token_score_penalty = 10.0;
  p_Var2 = &(this->token_matcher).children._M_t._M_impl.super__Rb_tree_header;
  (this->token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->token_matcher).has_value = false;
  (this->token_matcher).value = 0;
  puVar4 = (uint *)(precompiled_charsmap->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  uVar7 = (long)(precompiled_charsmap->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar4;
  if (uVar7 != 0) {
    uVar3 = *puVar4;
    uVar1 = (ulong)uVar3 + 4;
    if (uVar7 < uVar1 || uVar7 - uVar1 == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Index out of array bounds in precompiled charsmap!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->xcda_array = puVar4 + 1;
    this->xcda_array_size = (ulong)(uVar3 >> 2);
    this->prefix_replacements = (char *)(uVar1 + (long)puVar4);
    this->prefix_replacements_size = uVar7 - uVar1;
  }
  for (; _Var5._M_head_impl =
              (vocab->pimpl)._M_t.
              super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>._M_t
              .super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>.
              super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl,
      id_00 < (uint)(((long)*(pointer *)((long)&(_Var5._M_head_impl)->id_to_token + 8) -
                     *(long *)&((_Var5._M_head_impl)->id_to_token).
                               super__Vector_base<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>
                     ) / 0x28); id_00 = id_00 + 1) {
    ptVar8 = llama_vocab::get_token_data(vocab,id_00);
    bVar6 = llama_vocab::is_normal(vocab,id_00);
    if (bVar6) {
      fVar9 = ptVar8->score;
      if (this->min_score <= ptVar8->score) {
        fVar9 = this->min_score;
      }
      this->min_score = fVar9;
      fVar9 = ptVar8->score;
      if (ptVar8->score <= this->max_score) {
        fVar9 = this->max_score;
      }
      this->max_score = fVar9;
    }
    bVar6 = llama_vocab::is_normal(vocab,id_00);
    if (((bVar6) || (bVar6 = llama_vocab::is_user_defined(vocab,id_00), bVar6)) ||
       (bVar6 = llama_vocab::is_unused(vocab,id_00), bVar6)) {
      naive_trie::insert(&this->token_matcher,(ptVar8->text)._M_dataplus._M_p,
                         (ptVar8->text)._M_string_length,id_00);
    }
    bVar6 = llama_vocab::is_user_defined(vocab,id_00);
    if (bVar6) {
      naive_trie::insert(local_40,(ptVar8->text)._M_dataplus._M_p,(ptVar8->text)._M_string_length,0)
      ;
    }
  }
  this->unknown_token_score = this->min_score - this->unknown_token_score_penalty;
  return;
}

Assistant:

llm_tokenizer_ugm(const llama_vocab & vocab, const std::vector<char> & precompiled_charsmap) {
        if (precompiled_charsmap.size() > 0) {
            size_t charsmap_offset = 0;

            // First four bytes of precompiled_charsmap contains length of binary
            // blob containing XOR-compressed compact double array (XCDA) entries
            uint32_t xcda_blob_size = *(const uint32_t *) &precompiled_charsmap[0];
            charsmap_offset += sizeof(xcda_blob_size);
            if (xcda_blob_size + charsmap_offset >= precompiled_charsmap.size()) {
                throw std::runtime_error("Index out of array bounds in precompiled charsmap!");
            }

            // Next xcda_blob_size bytes contain entries of XOR-compressed compact
            // double array (XCDA). Each entry is bit-packed into a 32-bit integer.
            xcda_array = (const uint32_t *) &precompiled_charsmap[charsmap_offset];
            xcda_array_size = xcda_blob_size / sizeof(uint32_t);
            charsmap_offset += xcda_blob_size;

            // Remaining bytes of precompiled charsmap contain null-terminated
            // replacement strings for prefixes matched by the XCDA.
            prefix_replacements = &precompiled_charsmap[charsmap_offset];
            prefix_replacements_size = precompiled_charsmap.size() - charsmap_offset;
        }

        for (uint32_t id = 0; id < vocab.n_tokens(); ++id) {
            const auto & token_data = vocab.get_token_data(id);

            if (vocab.is_normal(id)) {
                min_score = std::min<float>(min_score, token_data.score);
                max_score = std::max<float>(max_score, token_data.score);
            }

            if (vocab.is_normal(id) ||
                vocab.is_user_defined(id) ||
                vocab.is_unused(id)) {
                token_matcher.insert(token_data.text.data(), token_data.text.size(), id);
            }

            if (vocab.is_user_defined(id)) {
                user_defined_token_matcher.insert(token_data.text.data(), token_data.text.size());
            }
        }

        unknown_token_score = min_score - unknown_token_score_penalty;
    }